

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# drop.cc
# Opt level: O3

void __thiscall verona::track::pre_block(track *this,Node *block)

{
  pointer psVar1;
  mapped_type *pmVar2;
  vector<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>
  *pvVar3;
  mapped_type *pmVar4;
  _Rb_tree<trieste::Location,_std::pair<const_trieste::Location,_bool>,_std::_Select1st<std::pair<const_trieste::Location,_bool>_>,_std::less<trieste::Location>,_std::allocator<std::pair<const_trieste::Location,_bool>_>_>
  *p_Var5;
  _Rb_tree<trieste::Location,_std::pair<const_trieste::Location,_bool>,_std::_Select1st<std::pair<const_trieste::Location,_bool>_>,_std::less<trieste::Location>,_std::allocator<std::pair<const_trieste::Location,_bool>_>_>
  *this_00;
  shared_ptr<trieste::NodeDef> *child;
  pointer psVar6;
  value_type parent;
  key_type local_40;
  
  if (this->llvm == false) {
    psVar6 = (this->stack).
             super__Vector_base<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if ((this->stack).
        super__Vector_base<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>
        ._M_impl.super__Vector_impl_data._M_start == psVar6) {
      p_Var5 = &::std::
                map<std::shared_ptr<trieste::NodeDef>,_std::map<trieste::Location,_bool,_std::less<trieste::Location>,_std::allocator<std::pair<const_trieste::Location,_bool>_>_>,_std::owner_less<void>,_std::allocator<std::pair<const_std::shared_ptr<trieste::NodeDef>,_std::map<trieste::Location,_bool,_std::less<trieste::Location>,_std::allocator<std::pair<const_trieste::Location,_bool>_>_>_>_>_>
                ::operator[](&this->lets,block)->_M_t;
      ::std::
      _Rb_tree<trieste::Location,_std::pair<const_trieste::Location,_bool>,_std::_Select1st<std::pair<const_trieste::Location,_bool>_>,_std::less<trieste::Location>,_std::allocator<std::pair<const_trieste::Location,_bool>_>_>
      ::operator=(p_Var5,&(this->params)._M_t);
    }
    else {
      local_40.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           psVar6[-1].super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      local_40.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           psVar6[-1].super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi;
      if (local_40.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          (local_40.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi)->_M_use_count =
               (local_40.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          (local_40.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi)->_M_use_count =
               (local_40.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi)->_M_use_count + 1;
        }
      }
      pmVar2 = ::std::
               map<std::shared_ptr<trieste::NodeDef>,_std::vector<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>,_std::owner_less<void>,_std::allocator<std::pair<const_std::shared_ptr<trieste::NodeDef>,_std::vector<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>_>_>_>
               ::operator[](&this->children,&local_40);
      psVar6 = (pmVar2->
               super__Vector_base<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      psVar1 = (pmVar2->
               super__Vector_base<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>
               )._M_impl.super__Vector_impl_data._M_finish;
      if (psVar6 != psVar1) {
        do {
          if (((psVar6->super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
              parent_ !=
              ((block->super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
              parent_) {
            pvVar3 = (vector<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>
                      *)::std::
                        map<std::shared_ptr<trieste::NodeDef>,_std::vector<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>,_std::owner_less<void>,_std::allocator<std::pair<const_std::shared_ptr<trieste::NodeDef>,_std::vector<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>_>_>_>
                        ::operator[](&this->successors,psVar6);
            ::std::
            vector<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>
            ::push_back(pvVar3,block);
          }
          psVar6 = psVar6 + 1;
        } while (psVar6 != psVar1);
      }
      pvVar3 = (vector<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>
                *)::std::
                  map<std::shared_ptr<trieste::NodeDef>,_std::vector<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>,_std::owner_less<void>,_std::allocator<std::pair<const_std::shared_ptr<trieste::NodeDef>,_std::vector<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>_>_>_>
                  ::operator[](&this->children,&local_40);
      ::std::
      vector<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>
      ::push_back(pvVar3,block);
      pmVar4 = ::std::
               map<std::shared_ptr<trieste::NodeDef>,_std::shared_ptr<trieste::NodeDef>,_std::owner_less<void>,_std::allocator<std::pair<const_std::shared_ptr<trieste::NodeDef>,_std::shared_ptr<trieste::NodeDef>_>_>_>
               ::operator[](&this->parents,block);
      (pmVar4->super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>)._M_ptr =
           local_40.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                (&(pmVar4->super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>).
                  _M_refcount,
                 &local_40.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
      p_Var5 = &::std::
                map<std::shared_ptr<trieste::NodeDef>,_std::map<trieste::Location,_bool,_std::less<trieste::Location>,_std::allocator<std::pair<const_trieste::Location,_bool>_>_>,_std::owner_less<void>,_std::allocator<std::pair<const_std::shared_ptr<trieste::NodeDef>,_std::map<trieste::Location,_bool,_std::less<trieste::Location>,_std::allocator<std::pair<const_trieste::Location,_bool>_>_>_>_>_>
                ::operator[](&this->lets,&local_40)->_M_t;
      this_00 = &::std::
                 map<std::shared_ptr<trieste::NodeDef>,_std::map<trieste::Location,_bool,_std::less<trieste::Location>,_std::allocator<std::pair<const_trieste::Location,_bool>_>_>,_std::owner_less<void>,_std::allocator<std::pair<const_std::shared_ptr<trieste::NodeDef>,_std::map<trieste::Location,_bool,_std::less<trieste::Location>,_std::allocator<std::pair<const_trieste::Location,_bool>_>_>_>_>_>
                 ::operator[](&this->lets,block)->_M_t;
      ::std::
      _Rb_tree<trieste::Location,_std::pair<const_trieste::Location,_bool>,_std::_Select1st<std::pair<const_trieste::Location,_bool>_>,_std::less<trieste::Location>,_std::allocator<std::pair<const_trieste::Location,_bool>_>_>
      ::operator=(this_00,p_Var5);
      if (local_40.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_40.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
    }
    ::std::
    vector<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>::
    push_back((vector<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>
               *)&this->stack,block);
    ::std::
    vector<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>::
    push_back((vector<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>
               *)this,block);
  }
  return;
}

Assistant:

void pre_block(Node block)
    {
      if (llvm)
        return;

      if (stack.empty())
      {
        lets[block] = params;
      }
      else
      {
        auto parent = stack.back();

        for (auto& child : children[parent])
        {
          // The new child is a successor of the old children unless it's a
          // sibling block in a conditional.
          if (child->parent() != block->parent())
            successors[child].push_back(block);
        }

        children[parent].push_back(block);
        parents[block] = parent;
        lets[block] = lets[parent];
      }

      stack.push_back(block);
      blocks.push_back(block);
    }